

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int __status;
  char cVar1;
  Maze *this;
  ostream *poVar2;
  allocator local_239;
  string local_238;
  ifstream MazeStream;
  
  if (argc == 2) {
    std::ifstream::ifstream(&MazeStream);
    std::ifstream::open((char *)&MazeStream,(_Ios_Openmode)argv[1]);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      std::ifstream::close();
      this = (Maze *)operator_new(0x2b8);
      std::__cxx11::string::string((string *)&local_238,"sampleInputForMaze.txt",&local_239);
      Maze::Maze(this,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      Maze::pathBetweenCells(this);
      Maze::~Maze(this);
      operator_delete(this,0x2b8);
      std::ifstream::~ifstream(&MazeStream);
      return 0;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Unable to open input file ->");
    poVar2 = std::operator<<(poVar2,argv[1]);
    std::operator<<(poVar2,"<-\n");
    __status = 2;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    std::operator<<(poVar2,
                    " inputFileNameThatContainsDictionary inputFileNameThatContainsPairsOfWords\n");
    __status = 1;
  }
  exit(__status);
}

Assistant:

int main(int argc, char *argv[]) { // the main function.
    if( argc != 2) {
        std::cout << "usage: " << argv[0] << " inputFileNameThatContainsDictionary inputFileNameThatContainsPairsOfWords\n";
        exit(1);
    }
    std::ifstream MazeStream;
    MazeStream.open(argv[1]);
    if( !MazeStream.is_open()) {
        std::cout << "Unable to open input file ->" << argv[1] << "<-\n";
        exit(2);
    }
    MazeStream.close();

    Maze *thePuzzle = new Maze("sampleInputForMaze.txt");
    //thePuzzle->printMaze();
    //std::cout<<std::endl;
    thePuzzle->pathBetweenCells();
    delete thePuzzle;
}